

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O3

void __thiscall
OptionParser_ShortFlagCombined_Test::TestBody(OptionParser_ShortFlagCombined_Test *this)

{
  bool bVar1;
  char *message;
  int count;
  AssertionResult gtest_ar;
  char *args [3];
  OptionParser parser;
  Message local_f8;
  int local_ec;
  internal local_e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  undefined1 local_d8 [16];
  _Manager_type local_c8;
  code *local_c0;
  AssertHelper local_b0;
  OptionParser local_a8;
  
  local_ec = 0;
  wabt::OptionParser::OptionParser(&local_a8,"prog","desc");
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc:46:38)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc:46:38)>
             ::_M_manager;
  local_d8._0_8_ = &local_ec;
  wabt::OptionParser::AddOption(&local_a8,'a',"a","help",(NullCallback *)local_d8);
  if (local_c8 != (_Manager_type)0x0) {
    (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
  }
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc:47:38)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc:47:38)>
             ::_M_manager;
  local_d8._0_8_ = &local_ec;
  wabt::OptionParser::AddOption(&local_a8,'b',"b","help",(NullCallback *)local_d8);
  if (local_c8 != (_Manager_type)0x0) {
    (*local_c8)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
  }
  local_c8 = (_Manager_type)0x275717;
  local_d8._0_8_ = "prog name";
  local_d8._8_8_ = "-aa";
  wabt::OptionParser::Parse(&local_a8,3,(char **)local_d8);
  local_f8.ss_.ptr_._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>(local_e8,"7","count",(int *)&local_f8,&local_ec);
  if (local_e8[0] == (internal)0x0) {
    testing::Message::Message(&local_f8);
    if (local_e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (CONCAT44(local_f8.ss_.ptr_._4_4_,local_f8.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_f8.ss_.ptr_._4_4_,local_f8.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_f8.ss_.ptr_._4_4_,local_f8.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_a8.on_error_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_a8.on_error_.super__Function_base._M_manager)
              ((_Any_data *)&local_a8.on_error_,(_Any_data *)&local_a8.on_error_,__destroy_functor);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            (&local_a8.arguments_);
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            (&local_a8.options_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.description_._M_dataplus._M_p != &local_a8.description_.field_2) {
    operator_delete(local_a8.description_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.program_name_._M_dataplus._M_p != &local_a8.program_name_.field_2) {
    operator_delete(local_a8.program_name_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(OptionParser, ShortFlagCombined) {
  int count = 0;
  OptionParser parser("prog", "desc");
  parser.AddOption('a', "a", "help", [&]() { count += 1; });
  parser.AddOption('b', "b", "help", [&]() { count += 2; });
  const char* args[] = {"prog name", "-aa", "-abb"};
  parser.Parse(3, const_cast<char**>(args));
  EXPECT_EQ(7, count);
}